

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7decomp.cpp
# Opt level: O2

bool bc7decomp::unpack_bc7_mode0_2(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  uint32_t i_2;
  uint32_t uVar1;
  undefined4 extraout_var;
  long lVar2;
  color_rgba *pcVar3;
  uint32_t e_1;
  uint32_t i;
  ulong uVar4;
  uint32_t c_1;
  long lVar5;
  byte bVar6;
  uint uVar7;
  uint32_t e;
  long lVar8;
  color_rgba *pcVar9;
  uint32_t p;
  ulong uVar10;
  uint32_t bits;
  uint32_t bit_offset;
  ulong local_140;
  color_rgba *local_138;
  uint32_t local_130;
  uint32_t local_12c;
  ulong local_128;
  color_rgba *local_120;
  color_rgba endpoints [6];
  uint32_t pbits [6];
  color_rgba block_colors [3] [8];
  uint32_t weights [16];
  
  bit_offset = 0;
  local_12c = read_bits32((uint8_t *)pBlock_bits,&bit_offset,mode + 1);
  local_130 = 1 << ((byte)mode & 0x1f);
  if (local_12c == local_130) {
    uVar7 = (uint)(mode == 0);
    bits = uVar7 + 2;
    local_140 = (ulong)mode;
    local_120 = pPixels;
    uVar1 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,(uint)(mode != 0) * 2 + 4);
    local_128 = CONCAT44(extraout_var,uVar1);
    pcVar3 = endpoints;
    lVar2 = 0;
    while (lVar2 != 3) {
      local_138 = (color_rgba *)lVar2;
      for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
        uVar1 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,mode == 0 ^ 5);
        pcVar3[lVar8].field_0.m_comps[0] = (uint8_t)uVar1;
      }
      pcVar3 = (color_rgba *)((long)&pcVar3->field_0 + 1);
      lVar2 = (long)local_138 + 1;
    }
    if ((int)local_140 == 0) {
      for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
        uVar1 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,1);
        pbits[lVar2] = uVar1;
      }
    }
    uVar10 = local_128 & 0xffffffff;
    uVar4 = 0;
    do {
      if (uVar4 == 0) {
LAB_0010a574:
        uVar1 = uVar7 + 1;
      }
      else {
        if (uVar4 == 0x10) goto LAB_0010a58d;
        if ((uVar4 == (byte)g_bc7_table_anchor_index_third_subset_1[uVar10]) ||
           (uVar1 = bits, uVar4 == (byte)g_bc7_table_anchor_index_third_subset_2[uVar10]))
        goto LAB_0010a574;
      }
      uVar1 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,uVar1);
      weights[uVar4] = uVar1;
      uVar4 = uVar4 + 1;
    } while( true );
  }
LAB_0010a6b9:
  return local_12c == local_130;
LAB_0010a58d:
  pcVar3 = endpoints;
  lVar2 = 0;
LAB_0010a599:
  if (lVar2 != 6) {
    lVar8 = 0;
    do {
      bVar6 = 0xff;
      if (lVar8 != 3) {
        if (lVar8 == 4) goto LAB_0010a5e3;
        bVar6 = (pcVar3->field_0).m_comps[lVar8];
        if ((int)local_140 == 0) {
          uVar7 = pbits[lVar2] << 3 | (uint)bVar6 << 4;
          bVar6 = (byte)(uVar7 >> 5);
        }
        else {
          uVar7 = (uint)bVar6 * 8;
          bVar6 = bVar6 >> 2;
        }
        bVar6 = bVar6 | (byte)uVar7;
      }
      (pcVar3->field_0).m_comps[lVar8] = bVar6;
      lVar8 = lVar8 + 1;
    } while( true );
  }
  pcVar3 = block_colors[0];
  pcVar9 = endpoints + 1;
  lVar2 = 0;
  while (lVar2 != 3) {
    local_140 = lVar2;
    local_138 = pcVar3;
    for (lVar8 = 0; (uint32_t)lVar8 >> (sbyte)bits == 0; lVar8 = lVar8 + 1) {
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        uVar1 = bc7_interp((uint)pcVar9[-1].field_0.m_comps[lVar5],
                           (uint)(pcVar9->field_0).m_comps[lVar5],(uint32_t)lVar8,bits);
        (((color_rgba *)&pcVar3->field_0)->field_0).m_comps[lVar5] = (uint8_t)uVar1;
      }
      block_colors[lVar2][lVar8].field_0.m_comps[3] = 0xff;
      pcVar3 = pcVar3 + 1;
    }
    pcVar9 = pcVar9 + 2;
    pcVar3 = local_138 + 8;
    lVar2 = local_140 + 1;
  }
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    local_120[lVar2].field_0 =
         block_colors[(byte)g_bc7_partition3[(ulong)(uint)((int)local_128 << 4) + lVar2]]
         [weights[lVar2]].field_0;
  }
  goto LAB_0010a6b9;
LAB_0010a5e3:
  lVar2 = lVar2 + 1;
  pcVar3 = pcVar3 + 1;
  goto LAB_0010a599;
}

Assistant:

bool unpack_bc7_mode0_2(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
{
	//const uint32_t SUBSETS = 3;
	const uint32_t ENDPOINTS = 6;
	const uint32_t COMPS = 3;
	const uint32_t WEIGHT_BITS = (mode == 0) ? 3 : 2;
	const uint32_t ENDPOINT_BITS = (mode == 0) ? 4 : 5;
	const uint32_t PBITS = (mode == 0) ? 6 : 0;
	const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
		
	uint32_t bit_offset = 0;
	const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

	if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

	const uint32_t part = read_bits32(pBuf, bit_offset, (mode == 0) ? 4 : 6);

	color_rgba endpoints[ENDPOINTS];
	for (uint32_t c = 0; c < COMPS; c++)
		for (uint32_t e = 0; e < ENDPOINTS; e++)
			endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, ENDPOINT_BITS);

	uint32_t pbits[6];
	for (uint32_t p = 0; p < PBITS; p++)
		pbits[p] = read_bits32(pBuf, bit_offset, 1);

	uint32_t weights[16];
	for (uint32_t i = 0; i < 16; i++)
		weights[i] = read_bits32(pBuf, bit_offset, ((!i) || (i == g_bc7_table_anchor_index_third_subset_1[part]) || (i == g_bc7_table_anchor_index_third_subset_2[part])) ? (WEIGHT_BITS - 1) : WEIGHT_BITS);

	assert(bit_offset == 128);

	for (uint32_t e = 0; e < ENDPOINTS; e++)
		for (uint32_t c = 0; c < 4; c++)
			endpoints[e][c] = (uint8_t)((c == 3) ? 255 : (PBITS ? bc7_dequant(endpoints[e][c], pbits[e], ENDPOINT_BITS) : bc7_dequant(endpoints[e][c], ENDPOINT_BITS)));

	color_rgba block_colors[3][8];
	for (uint32_t s = 0; s < 3; s++)
		for (uint32_t i = 0; i < WEIGHT_VALS; i++)
		{
			for (uint32_t c = 0; c < 3; c++)
				block_colors[s][i][c] = (uint8_t)bc7_interp(endpoints[s * 2 + 0][c], endpoints[s * 2 + 1][c], i, WEIGHT_BITS);
			block_colors[s][i][3] = 255;
		}

	for (uint32_t i = 0; i < 16; i++)
		pPixels[i] = block_colors[g_bc7_partition3[part * 16 + i]][weights[i]];

	return true;
}